

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::allocate(Image *this)

{
  uint8 *puVar1;
  Image *this_local;
  
  if (this->pixels == (uint8 *)0x0) {
    this->stride = this->width * this->bpp;
    puVar1 = (uint8 *)mustmalloc_LOC((long)(this->stride * this->height),0x30018,
                                     "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 83"
                                    );
    this->pixels = puVar1;
    this->flags = this->flags | 1;
  }
  if (this->palette == (uint8 *)0x0) {
    if ((this->depth == 4) || (this->depth == 8)) {
      puVar1 = (uint8 *)mustmalloc_LOC((long)((1 << ((byte)this->depth & 0x1f)) << 2),0x30018,
                                       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 88"
                                      );
      this->palette = puVar1;
    }
    this->flags = this->flags | 2;
  }
  return;
}

Assistant:

void
Image::allocate(void)
{
	if(this->pixels == nil){
		this->stride = this->width*this->bpp;
		this->pixels = rwNewT(uint8, this->stride*this->height, MEMDUR_EVENT | ID_IMAGE);
		this->flags |= 1;
	}
	if(this->palette == nil){
		if(this->depth == 4 || this->depth == 8)
			this->palette = rwNewT(uint8, (1 << this->depth)*4, MEMDUR_EVENT | ID_IMAGE);
		this->flags |= 2;
	}
}